

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ValueArg(ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,string *flag,string *name,string *desc,bool req,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,string *typeDesc,
        CmdLineInterface *parser,Visitor *v)

{
  undefined8 *in_RDI;
  string *in_R9;
  string *in_stack_00000008;
  long *in_stack_00000010;
  bool in_stack_000003b6;
  bool in_stack_000003b7;
  string *in_stack_000003b8;
  string *in_stack_000003c0;
  string *in_stack_000003c8;
  Arg *in_stack_000003d0;
  Visitor *in_stack_000003e0;
  
  Arg::Arg(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b7
           ,in_stack_000003b6,in_stack_000003e0);
  *in_RDI = &PTR__ValueArg_00158c90;
  std::__cxx11::string::string((string *)(in_RDI + 0x15),in_R9);
  std::__cxx11::string::string((string *)(in_RDI + 0x19),in_R9);
  std::__cxx11::string::string((string *)(in_RDI + 0x1d),in_stack_00000008);
  in_RDI[0x21] = 0;
  (**(code **)(*in_stack_00000010 + 0x18))();
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      CmdLineInterface& parser,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ 
    parser.add( this );
}